

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webserver.c
# Opt level: O0

void web_server_callback(http_parser_t *parser,http_message_t *req,SOCKINFO *info)

{
  undefined1 local_290 [8];
  SendInstruction RespInstr;
  xml_alias_t xmldoc;
  membuffer filename;
  membuffer headers;
  int local_28;
  resp_type rtype;
  int timeout;
  int ret;
  SOCKINFO *info_local;
  http_message_t *req_local;
  http_parser_t *parser_local;
  
  local_28 = -1;
  headers.size_inc._4_4_ = 0;
  _timeout = info;
  info_local = (SOCKINFO *)req;
  req_local = &parser->msg;
  memset(local_290,0,0x1d0);
  membuffer_init((membuffer *)&filename.size_inc);
  membuffer_init((membuffer *)&xmldoc.ct);
  rtype = process_request(_timeout,(http_message_t *)info_local,
                          (resp_type *)((long)&headers.size_inc + 4),(membuffer *)&filename.size_inc
                          ,(membuffer *)&xmldoc.ct,(xml_alias_t *)&RespInstr.RequestCookie,
                          (SendInstruction *)local_290);
  if (rtype == 200) {
    switch(headers.size_inc._4_4_) {
    case 0:
      http_SendMessage(_timeout,&local_28,"Ibf",local_290,filename.size_inc,headers.buf,xmldoc.ct);
      break;
    case 1:
      http_SendMessage(_timeout,&local_28,"Ibb",local_290,filename.size_inc,headers.buf,
                       xmldoc.name.size_inc,xmldoc.doc.buf);
      alias_release((xml_alias_t *)&RespInstr.RequestCookie);
      break;
    case 2:
      http_SendMessage(_timeout,&local_28,"b",filename.size_inc,headers.buf);
      break;
    case 3:
      http_SendMessage(_timeout,&local_28,"Ibf",local_290,filename.size_inc,headers.buf,xmldoc.ct);
      break;
    case 4:
      rtype = http_RecvPostMessage
                        ((http_parser_t *)req_local,_timeout,(char *)xmldoc.ct,
                         (SendInstruction *)local_290);
      http_MakeMessage((membuffer *)&filename.size_inc,1,1,"RTLSXcCc",(ulong)rtype,"text/html",
                       local_290,"redsonic");
      http_SendMessage(_timeout,&local_28,"b",filename.size_inc,headers.buf);
      break;
    default:
      UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/webserver.c",0x716,
                 "webserver: Invalid response type received.\n");
      __assert_fail("0",".upnp/src/genlib/net/http/webserver.c",0x718,
                    "void web_server_callback(http_parser_t *, http_message_t *, SOCKINFO *)");
    }
  }
  else {
    http_SendStatusResponse
              (_timeout,rtype,*(int *)((long)&info_local[1].foreign_sockaddr.__ss_align + 4),
               info_local[2].socket);
  }
  UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/webserver.c",0x71e,
             "webserver: request processed...\n");
  membuffer_destroy((membuffer *)&filename.size_inc);
  membuffer_destroy((membuffer *)&xmldoc.ct);
  return;
}

Assistant:

void web_server_callback(
	http_parser_t *parser, /* INOUT */ http_message_t *req, SOCKINFO *info)
{
	int ret;
	int timeout = -1;
	enum resp_type rtype = 0;
	membuffer headers;
	membuffer filename;
	struct xml_alias_t xmldoc;
	struct SendInstruction RespInstr;

	/* init */
	memset(&RespInstr, 0, sizeof(RespInstr));
	membuffer_init(&headers);
	membuffer_init(&filename);

	/* Process request should create the different kind of header depending
	 * on the type of request. */
	ret = process_request(
		info, req, &rtype, &headers, &filename, &xmldoc, &RespInstr);
	if (ret != HTTP_OK) {
		/* send error code */
		http_SendStatusResponse(
			info, ret, req->major_version, req->minor_version);
	} else {
		/* send response */
		switch (rtype) {
		case RESP_FILEDOC:
			http_SendMessage(info,
				&timeout,
				"Ibf",
				&RespInstr,
				headers.buf,
				headers.length,
				filename.buf);
			break;
		case RESP_XMLDOC:
			http_SendMessage(info,
				&timeout,
				"Ibb",
				&RespInstr,
				headers.buf,
				headers.length,
				xmldoc.doc.buf,
				xmldoc.doc.length);
			alias_release(&xmldoc);
			break;
		case RESP_WEBDOC:
			/*http_SendVirtualDirDoc(info, &timeout, "Ibf",
				&RespInstr,
				headers.buf, headers.length,
				filename.buf);*/
			http_SendMessage(info,
				&timeout,
				"Ibf",
				&RespInstr,
				headers.buf,
				headers.length,
				filename.buf);
			break;
		case RESP_HEADERS:
			/* headers only */
			http_SendMessage(info,
				&timeout,
				"b",
				headers.buf,
				headers.length);
			break;
		case RESP_POST:
			/* headers only */
			ret = http_RecvPostMessage(
				parser, info, filename.buf, &RespInstr);
			/* Send response. */
			http_MakeMessage(&headers,
				1,
				1,
				"RTLSXcCc",
				ret,
				"text/html",
				&RespInstr,
				X_USER_AGENT);
			http_SendMessage(info,
				&timeout,
				"b",
				headers.buf,
				headers.length);
			break;
		default:
			UpnpPrintf(UPNP_INFO,
				HTTP,
				__FILE__,
				__LINE__,
				"webserver: Invalid response type received.\n");
			assert(0);
		}
	}
	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"webserver: request processed...\n");
	membuffer_destroy(&headers);
	membuffer_destroy(&filename);
}